

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

cb_item * __thiscall Fl_Check_Browser::find_item(Fl_Check_Browser *this,int n)

{
  Fl_Check_Browser *local_28;
  cb_item *p;
  int i;
  int n_local;
  Fl_Check_Browser *this_local;
  
  local_28 = (Fl_Check_Browser *)this->first;
  if (((n < 1) || (this->nitems_ < n)) || (local_28 == (Fl_Check_Browser *)0x0)) {
    this_local = (Fl_Check_Browser *)0x0;
  }
  else {
    if (n == this->cached_item) {
      local_28 = (Fl_Check_Browser *)this->cache;
      p._4_4_ = 1;
    }
    else if (n == this->cached_item + 1) {
      local_28 = (Fl_Check_Browser *)this->cache->next;
      p._4_4_ = 1;
    }
    else {
      p._4_4_ = n;
      if (n == this->cached_item + -1) {
        local_28 = (Fl_Check_Browser *)this->cache->prev;
        p._4_4_ = 1;
      }
    }
    while (p._4_4_ = p._4_4_ + -1, p._4_4_ != 0) {
      local_28 = (Fl_Check_Browser *)
                 (local_28->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget;
    }
    this->cache = (cb_item *)local_28;
    this->cached_item = n;
    this_local = local_28;
  }
  return (cb_item *)this_local;
}

Assistant:

Fl_Check_Browser::cb_item *Fl_Check_Browser::find_item(int n) const {
	int i = n;
	cb_item *p = first;

	if (n <= 0 || n > nitems_ || p == 0) {
		return 0;
	}

	if (n == cached_item) {
		p = cache;
		n = 1;
	} else if (n == cached_item + 1) {
		p = cache->next;
		n = 1;
	} else if (n == cached_item - 1) {
		p = cache->prev;
		n = 1;
	}

	while (--n) {
		p = p->next;
	}

	/* Cast to not const and cache it. */

	((Fl_Check_Browser *)this)->cache = p;
	((Fl_Check_Browser *)this)->cached_item = i;

	return p;
}